

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_ht_spkitable.c
# Opt level: O0

void test_ht_1(void)

{
  long lVar1;
  int iVar2;
  rtr_socket *socket;
  rtr_socket *socket_00;
  spki_record *__ptr;
  long in_FS_OFFSET;
  uint local_1d8;
  uint local_1d4;
  uint i_2;
  uint i_1;
  int count;
  int i;
  spki_record *record;
  uint32_t asn;
  rtr_socket *socket_two;
  rtr_socket *socket_one;
  spki_record *psStack_1a0;
  uint result_len;
  spki_record *result;
  uint8_t ski [20];
  spki_table table;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  socket = (rtr_socket *)malloc(0x80);
  socket_00 = (rtr_socket *)malloc(0x80);
  __ptr = create_record(1,0,0,(rtr_socket *)0x0);
  spki_table_init((spki_table *)(ski + 0x10),(spki_update_fp)0x0);
  result = *(spki_record **)__ptr->ski;
  ski._0_8_ = *(undefined8 *)(__ptr->ski + 8);
  ski._8_4_ = *(undefined4 *)(__ptr->ski + 0x10);
  free(__ptr);
  for (i_1 = 0; (int)i_1 < 0xff; i_1 = i_1 + 1) {
    if ((int)i_1 % 2 == 0) {
      _count = create_record(1,0,i_1,socket_00);
    }
    else {
      _count = create_record(1,0,i_1,socket);
    }
    _spki_table_add_assert((spki_table *)(ski + 0x10),_count);
    free(_count);
  }
  i_2 = 0;
  spki_table_get_all((spki_table *)(ski + 0x10),1,(uint8_t *)&result,&stack0xfffffffffffffe60,
                     (uint *)((long)&socket_one + 4));
  local_1d4 = 0;
  while( true ) {
    if (socket_one._4_4_ <= local_1d4) {
      if (i_2 != 0xff) {
        __assert_fail("count == 255",
                      "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                      ,0x97,"void test_ht_1(void)");
      }
      free(psStack_1a0);
      spki_table_src_remove((spki_table *)(ski + 0x10),socket);
      spki_table_get_all((spki_table *)(ski + 0x10),1,(uint8_t *)&result,&stack0xfffffffffffffe60,
                         (uint *)((long)&socket_one + 4));
      local_1d8 = 0;
      while( true ) {
        if (socket_one._4_4_ <= local_1d8) {
          spki_table_free((spki_table *)(ski + 0x10));
          free(psStack_1a0);
          free(socket);
          free(socket_00);
          printf("%s() complete\n","test_ht_1");
          if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
            return;
          }
          __stack_chk_fail();
        }
        if (psStack_1a0[local_1d8].asn != 1) {
          __assert_fail("result[i].asn == asn",
                        "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                        ,0x9f,"void test_ht_1(void)");
        }
        iVar2 = memcmp(psStack_1a0 + local_1d8,&result,0x14);
        if (iVar2 != 0) {
          __assert_fail("memcmp(&result[i].ski, ski, SKI_SIZE) == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                        ,0xa0,"void test_ht_1(void)");
        }
        if (psStack_1a0[local_1d8].socket != socket_00) break;
        local_1d8 = local_1d8 + 1;
      }
      __assert_fail("result[i].socket == socket_two",
                    "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                    ,0xa1,"void test_ht_1(void)");
    }
    if (psStack_1a0->asn != 1) {
      __assert_fail("result->asn == asn",
                    "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                    ,0x93,"void test_ht_1(void)");
    }
    iVar2 = memcmp(psStack_1a0 + local_1d4,&result,0x14);
    if (iVar2 != 0) break;
    i_2 = i_2 + 1;
    local_1d4 = local_1d4 + 1;
  }
  __assert_fail("memcmp(&result[i].ski, ski, SKI_SIZE) == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                ,0x94,"void test_ht_1(void)");
}

Assistant:

static void test_ht_1(void)
{
	struct spki_table table;
	struct rtr_socket *socket_one = malloc(sizeof(struct rtr_socket));
	struct rtr_socket *socket_two = malloc(sizeof(struct rtr_socket));
	uint8_t ski[SKI_SIZE];
	uint32_t asn = 1;

	/* test create record */
	struct spki_record *record = create_record(1, 0, 0, NULL);

	spki_table_init(&table, NULL);
	memcpy(ski, record->ski, 20);
	free(record);

	/* create and add records with either socket_one or socket_two */
	for (int i = 0; i < 255; i++) {
		if (i % 2)
			record = create_record(1, 0, i, socket_one);
		else
			record = create_record(1, 0, i, socket_two);

		_spki_table_add_assert(&table, record);
		free(record);
	}

	struct spki_record *result;
	unsigned int result_len;
	int count = 0;
	/* verify all (255) records for asn and ski size */
	spki_table_get_all(&table, asn, ski, &result, &result_len);
	for (unsigned int i = 0; i < result_len; i++) {
		assert(result->asn == asn);
		assert(memcmp(&result[i].ski, ski, SKI_SIZE) == 0);
		count++;
	}
	assert(count == 255);
	free(result);

	/* remove all records with socket_one */
	spki_table_src_remove(&table, socket_one);
	/* verify remaining records have socket_two */
	spki_table_get_all(&table, asn, ski, &result, &result_len);
	for (unsigned int i = 0; i < result_len; i++) {
		assert(result[i].asn == asn);
		assert(memcmp(&result[i].ski, ski, SKI_SIZE) == 0);
		assert(result[i].socket == socket_two);
	}

	/* cleanup: free memory */
	spki_table_free(&table);
	free(result);
	free(socket_one);
	free(socket_two);
	printf("%s() complete\n", __func__);
}